

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float tcu::anon_unknown_74::channelToFloat(deUint8 *value,ChannelType type)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  switch(type) {
  case SNORM_INT8:
    fVar3 = (float)(int)(char)*value / 127.0;
    goto LAB_00300b57;
  case SNORM_INT16:
    fVar3 = (float)(int)*(short *)value / 32767.0;
    goto LAB_00300b57;
  case SNORM_INT32:
    fVar3 = (float)*(int *)value * 4.656613e-10;
LAB_00300b57:
    fVar2 = -1.0;
    if (-1.0 <= fVar3) {
      fVar2 = fVar3;
    }
    return fVar2;
  case UNORM_INT8:
    return (float)*value / 255.0;
  case UNORM_INT16:
    return (float)*(ushort *)value / 65535.0;
  case UNORM_INT24:
    return (float)*(uint3 *)value / 16777215.0;
  case UNORM_INT32:
    return (float)*(uint *)value * 2.3283064e-10;
  default:
    return 0.0;
  case SIGNED_INT8:
    uVar1 = (uint)(char)*value;
    break;
  case SIGNED_INT16:
    uVar1 = (uint)*(short *)value;
    break;
  case SIGNED_INT32:
    return (float)*(int *)value;
  case UNSIGNED_INT8:
    uVar1 = (uint)*value;
    break;
  case UNSIGNED_INT16:
    uVar1 = (uint)*(ushort *)value;
    break;
  case UNSIGNED_INT24:
    return (float)*(uint3 *)value;
  case UNSIGNED_INT32:
    return (float)*(uint *)value;
  case HALF_FLOAT:
    fVar3 = deFloat16To32(*(deFloat16 *)value);
    return fVar3;
  case FLOAT:
    return *(float *)value;
  case FLOAT64:
    return (float)*(double *)value;
  }
  return (float)(int)uVar1;
}

Assistant:

inline float channelToFloat (const deUint8* value, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			return de::max(-1.0f, (float)*((const deInt8*)value) / 127.0f);
		case TextureFormat::SNORM_INT16:		return de::max(-1.0f, (float)*((const deInt16*)value) / 32767.0f);
		case TextureFormat::SNORM_INT32:		return de::max(-1.0f, (float)*((const deInt32*)value) / 2147483647.0f);
		case TextureFormat::UNORM_INT8:			return (float)*((const deUint8*)value) / 255.0f;
		case TextureFormat::UNORM_INT16:		return (float)*((const deUint16*)value) / 65535.0f;
		case TextureFormat::UNORM_INT24:		return (float)readUint24(value) / 16777215.0f;
		case TextureFormat::UNORM_INT32:		return (float)*((const deUint32*)value) / 4294967295.0f;
		case TextureFormat::SIGNED_INT8:		return (float)*((const deInt8*)value);
		case TextureFormat::SIGNED_INT16:		return (float)*((const deInt16*)value);
		case TextureFormat::SIGNED_INT32:		return (float)*((const deInt32*)value);
		case TextureFormat::UNSIGNED_INT8:		return (float)*((const deUint8*)value);
		case TextureFormat::UNSIGNED_INT16:		return (float)*((const deUint16*)value);
		case TextureFormat::UNSIGNED_INT24:		return (float)readUint24(value);
		case TextureFormat::UNSIGNED_INT32:		return (float)*((const deUint32*)value);
		case TextureFormat::HALF_FLOAT:			return deFloat16To32(*(const deFloat16*)value);
		case TextureFormat::FLOAT:				return *((const float*)value);
		case TextureFormat::FLOAT64:			return (float)*((const double*)value);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}